

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_force_event(intptr_t uuid,fio_io_event ev)

{
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  fio_defer_task_s task_01;
  uint uVar1;
  fio_io_event ev_local;
  intptr_t uuid_local;
  
  if (((-1 < uuid) && (uVar1 = (uint)((ulong)uuid >> 8), uVar1 < fio_data->capa)) &&
     ((uuid & 0xffU) == (ulong)*(byte *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6d))) {
    if (ev == FIO_EVENT_ON_DATA) {
      fio_trylock((fio_lock_i *)((long)fio_data + (long)(int)uVar1 * 0xa8 + 0x6b));
      task.arg1 = (void *)uuid;
      task.func = deferred_on_data;
      task.arg2 = &DAT_00000001;
      fio_defer_push_task_fn(task,&task_queue_normal);
      fio_defer_thread_signal();
    }
    else if (ev == FIO_EVENT_ON_READY) {
      task_01.arg1 = (void *)uuid;
      task_01.func = deferred_on_ready;
      task_01.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task_01,&task_queue_urgent);
    }
    else if (ev == FIO_EVENT_ON_TIMEOUT) {
      task_00.arg1 = (void *)uuid;
      task_00.func = deferred_ping;
      task_00.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task_00,&task_queue_normal);
      fio_defer_thread_signal();
    }
  }
  return;
}

Assistant:

void fio_force_event(intptr_t uuid, enum fio_io_event ev) {
  if (!uuid_is_valid(uuid))
    return;
  switch (ev) {
  case FIO_EVENT_ON_DATA:
    fio_trylock(&uuid_data(uuid).scheduled);
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
    break;
  case FIO_EVENT_ON_TIMEOUT:
    fio_defer_push_task(deferred_ping, (void *)uuid, NULL);
    break;
  case FIO_EVENT_ON_READY:
    fio_defer_push_urgent(deferred_on_ready, (void *)uuid, NULL);
    break;
  }
}